

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_cpio.c
# Opt level: O1

void test_write_format_cpio(void)

{
  test_format(archive_write_set_format_cpio);
  test_format(archive_write_set_format_cpio_newc);
  test_big_entries(archive_write_set_format_cpio,0x1ffffffff,0);
  test_big_entries(archive_write_set_format_cpio,0x200000000,-0x19);
  test_big_entries(archive_write_set_format_cpio_newc,0xffffffff,0);
  test_big_entries(archive_write_set_format_cpio_newc,0x100000000,-0x19);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_cpio)
{
	int64_t size_4g = ((int64_t)1) << 32;
	int64_t size_8g = ((int64_t)1) << 33;

	test_format(archive_write_set_format_cpio);
	test_format(archive_write_set_format_cpio_newc);

	test_big_entries(archive_write_set_format_cpio,
	    size_8g - 1, ARCHIVE_OK);
	test_big_entries(archive_write_set_format_cpio,
	    size_8g, ARCHIVE_FAILED);
	test_big_entries(archive_write_set_format_cpio_newc,
	    size_4g - 1, ARCHIVE_OK);
	test_big_entries(archive_write_set_format_cpio_newc,
	    size_4g, ARCHIVE_FAILED);
}